

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O1

int cmp_greediness(Parser *p,PNode *x,PNode *y)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  PNode *pPVar4;
  PNode *pPVar5;
  char *pcVar6;
  char *pcVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  VecPNode pvx;
  VecPNode pvy;
  VecPNode local_58;
  VecPNode local_30;
  
  local_58.n = 0;
  local_58.v = (PNode **)0x0;
  local_30.n = 0;
  local_30.v = (PNode **)0x0;
  get_unshared_pnodes(p,x,y,&local_58,&local_30);
  if (local_58.v != (PNode **)0x0) {
    qsort(local_58.v,(ulong)local_58.n,8,greedycmp);
  }
  if (local_30.v != (PNode **)0x0) {
    qsort(local_30.v,(ulong)local_30.n,8,greedycmp);
  }
  iVar8 = 0;
  if (local_30.n == 0 || local_58.n == 0) {
LAB_00127aad:
    if (local_58.v != local_58.e && local_58.v != (PNode **)0x0) {
      free(local_58.v);
    }
    local_58.n = 0;
    local_58.v = (PNode **)0x0;
    if (local_30.v != local_30.e && local_30.v != (PNode **)0x0) {
      free(local_30.v);
    }
    return iVar8;
  }
  uVar9 = 0;
  uVar10 = 0;
LAB_00127a39:
  pPVar4 = local_58.v[uVar10];
  pPVar5 = local_30.v[uVar9];
  if (pPVar4 == pPVar5) {
LAB_00127a9d:
    uVar10 = uVar10 + 1;
  }
  else {
    pcVar6 = (pPVar5->parse_node).start_loc.s;
    pcVar7 = (pPVar4->parse_node).start_loc.s;
    if (pcVar7 < pcVar6) {
LAB_00127a5c:
      uVar10 = uVar10 + 1;
      goto LAB_00127aa2;
    }
    if (pcVar7 <= pcVar6) {
      iVar8 = (pPVar5->parse_node).symbol;
      iVar1 = (pPVar4->parse_node).symbol;
      if (iVar1 < iVar8) goto LAB_00127a5c;
      if (iVar8 < iVar1) goto LAB_00127aa0;
      pcVar6 = (pPVar5->parse_node).end;
      iVar8 = -1;
      pcVar7 = (pPVar4->parse_node).end;
      if (pcVar7 <= pcVar6) {
        if (pcVar7 < pcVar6) {
          iVar8 = 1;
        }
        else {
          uVar2 = (pPVar5->children).n;
          uVar3 = (pPVar4->children).n;
          if ((uVar2 <= uVar3) && (iVar8 = 1, uVar3 <= uVar2)) goto LAB_00127a9d;
        }
      }
      goto LAB_00127aad;
    }
  }
LAB_00127aa0:
  uVar9 = uVar9 + 1;
LAB_00127aa2:
  iVar8 = 0;
  if ((local_58.n <= uVar10) || (local_30.n <= uVar9)) goto LAB_00127aad;
  goto LAB_00127a39;
}

Assistant:

static int cmp_greediness(Parser *p, PNode *x, PNode *y) {
  uint ix = 0, iy = 0;
  int ret = 0;

  VecPNode pvx, pvy;
  vec_clear(&pvx);
  vec_clear(&pvy);
  get_unshared_pnodes(p, x, y, &pvx, &pvy);
  if (pvx.v != NULL) qsort(pvx.v, pvx.n, sizeof(PNode *), greedycmp);
  if (pvy.v != NULL) qsort(pvy.v, pvy.n, sizeof(PNode *), greedycmp);
  while (1) {
    if (pvx.n <= ix || pvy.n <= iy) RET(0);
    x = pvx.v[ix];
    y = pvy.v[iy];
    if (x == y) {
      ix++;
      iy++;
    } else if (x->parse_node.start_loc.s < y->parse_node.start_loc.s)
      ix++;
    else if (x->parse_node.start_loc.s > y->parse_node.start_loc.s)
      iy++;
    else if (x->parse_node.symbol < y->parse_node.symbol)
      ix++;
    else if (x->parse_node.symbol > y->parse_node.symbol)
      iy++;
    else if (x->parse_node.end > y->parse_node.end)
      RET(-1);
    else if (x->parse_node.end < y->parse_node.end)
      RET(1);
    else if (x->children.n < y->children.n)
      RET(-1);
    else if (x->children.n > y->children.n)
      RET(1);
    else {
      ix++;
      iy++;
    }
  }
Lreturn:
  vec_free(&pvx);
  vec_free(&pvy);
  return ret;
}